

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Imputer::set_allocated_imputeddoublearray
          (Imputer *this,DoubleVector *imputeddoublearray)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  DoubleVector *imputeddoublearray_local;
  Imputer *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_ImputedValue(this);
  if (imputeddoublearray != (DoubleVector *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&imputeddoublearray->super_MessageLite);
    message_arena = (Arena *)imputeddoublearray;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<CoreML::Specification::DoubleVector>
                              (message_arena_00,imputeddoublearray,submessage_arena_00);
    }
    set_has_imputeddoublearray(this);
    (this->ImputedValue_).imputeddoublearray_ = (DoubleVector *)message_arena;
  }
  return;
}

Assistant:

void Imputer::set_allocated_imputeddoublearray(::CoreML::Specification::DoubleVector* imputeddoublearray) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_ImputedValue();
  if (imputeddoublearray) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(imputeddoublearray));
    if (message_arena != submessage_arena) {
      imputeddoublearray = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, imputeddoublearray, submessage_arena);
    }
    set_has_imputeddoublearray();
    ImputedValue_.imputeddoublearray_ = imputeddoublearray;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Imputer.imputedDoubleArray)
}